

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O0

void chapter3::initialize_exclude_set
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *exclude_set)

{
  int iVar1;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  undefined1 *local_18;
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *exclude_set_local;
  
  local_10 = (set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)exclude_set;
  if (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
      ::exclude_words_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                                 ::exclude_words_abi_cxx11_);
    if (iVar1 != 0) {
      local_18 = initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                 ::exclude_words_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                 ::exclude_words_abi_cxx11_,"a",&local_19);
      local_18 = (undefined1 *)0x12f2b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 0x20),"an",local_2d);
      local_18 = (undefined1 *)0x12f2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 0x40),"or",&local_2e);
      local_18 = (undefined1 *)0x12f2f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 0x60),"the",&local_2f);
      local_18 = (undefined1 *)0x12f310;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 0x80),"and",&local_30);
      local_18 = (undefined1 *)0x12f330;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 (initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                  ::exclude_words_abi_cxx11_ + 0xa0),"but",&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                           ::exclude_words_abi_cxx11_);
    }
  }
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  insert<std::__cxx11::string*>
            (local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
                      ::exclude_words_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &initialize_exclude_set(std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)
              ::exclude_words_abi_cxx11_);
  return;
}

Assistant:

inline void chapter3::initialize_exclude_set(set<string> &exclude_set) {
    static string exclude_words[] = {
            "a", "an", "or", "the", "and", "but"
    };
    exclude_set.insert(exclude_words, exclude_words + sizeof(exclude_words) / sizeof(*exclude_words));
    // set<string> exclude_set(filter_str_array, filter_str_array + sizeof(filter_str_array) / sizeof(*filter_str_array));
    /*cout << sizeof(filter_str_array) << endl;
    cout << filter_str_array << endl;
    cout << sizeof(*filter_str_array) << endl;
    cout << *filter_str_array << endl;
    cout << sizeof(filter_str_array) / sizeof(*filter_str_array) << endl;
    cout << filter_sets.size() << endl;*/
}